

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_standard_midi.cpp
# Opt level: O3

void midi_processor::process_standard_midi_track
               (const_iterator *it,const_iterator end,midi_container *p_out,bool is_gmf)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  unsigned_long p_timestamp;
  size_t p_data_count;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  midi_track track;
  uint local_d4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  ulong local_a8;
  ulong local_a0;
  midi_event local_98;
  midi_track local_58;
  undefined4 local_3c;
  midi_container *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,is_gmf);
  local_58.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c8,3);
  p_timestamp = 0;
  local_38 = p_out;
  if (it->_M_current != end._M_current) {
    local_a0 = 0;
    local_a8 = 0;
    uVar5 = 0;
    local_d4 = 0;
    bVar7 = 0xff;
    while( true ) {
      uVar4 = decode_delta(it,end);
      pbVar2 = it->_M_current;
      if (pbVar2 == end._M_current) break;
      uVar3 = -uVar4;
      if (0 < (int)uVar4) {
        uVar3 = uVar4;
      }
      if (1000000 < uVar3) break;
      it->_M_current = pbVar2 + 1;
      bVar1 = *pbVar2;
      bVar9 = bVar1;
      if (-1 < (char)bVar1) {
        if (bVar7 == 0xff) break;
        *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start = bVar1;
        bVar9 = bVar7;
      }
      local_a0 = (ulong)((int)local_a0 + uVar3);
      uVar4 = (uint)bVar9;
      if (bVar9 < 0xf0) {
        if (uVar5 != 0) {
          midi_event::midi_event
                    (&local_98,(ulong)local_d4,extended,0,
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(ulong)uVar5);
          midi_track::add_event(&local_58,&local_98);
          if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_a8 = (ulong)local_d4;
        }
        uVar6 = local_a0;
        uVar5 = 0;
        if (((byte)local_3c & (uVar4 & 0xfffffff0) == 0xe0) == 0) {
          if ((char)bVar1 < '\0') {
            pbVar2 = it->_M_current;
            if (pbVar2 == end._M_current) break;
            it->_M_current = pbVar2 + 1;
            *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = *pbVar2;
          }
          p_data_count = 1;
          if ((bVar9 & 0xe0 | 0x10) != 0xd0) {
            pbVar2 = it->_M_current;
            if (pbVar2 == end._M_current) break;
            it->_M_current = pbVar2 + 1;
            local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1] = *pbVar2;
            p_data_count = 2;
          }
          midi_event::midi_event
                    (&local_98,local_a0 & 0xffffffff,(bVar9 >> 4) + ~extended,uVar4 & 0xf,
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,p_data_count);
          midi_track::add_event(&local_58,&local_98);
          if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_a8 = uVar6;
        }
      }
      else if (bVar9 == 0xff) {
        if (uVar5 != 0) {
          midi_event::midi_event
                    (&local_98,(ulong)local_d4,extended,0,
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(ulong)uVar5);
          midi_track::add_event(&local_58,&local_98);
          if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_a8 = (ulong)local_d4;
        }
        pbVar2 = it->_M_current;
        if ((pbVar2 == end._M_current) ||
           (it->_M_current = pbVar2 + 1, pbVar2 + 1 == end._M_current)) break;
        bVar1 = *pbVar2;
        uVar5 = decode_delta(it,end);
        if (((int)uVar5 < 0) ||
           (uVar6 = (ulong)uVar5, (long)end._M_current - (long)it->_M_current < (long)uVar6)) break;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_c8,(ulong)(uVar5 + 2));
        *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start = 0xff;
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1] = bVar1;
        if (uVar5 != 0) {
          memmove(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + 2,it->_M_current,uVar6);
        }
        uVar8 = local_a0;
        it->_M_current = it->_M_current + uVar6;
        uVar6 = local_a8;
        if (bVar1 != 0x2f) {
          uVar6 = local_a0;
        }
        midi_event::midi_event
                  (&local_98,uVar6 & 0xffffffff,extended,0,
                   local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(ulong)(uVar5 + 2));
        midi_track::add_event(&local_58,&local_98);
        if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_a8 = uVar8;
        bVar9 = bVar7;
        uVar5 = 0;
        if (bVar1 == 0x2f) goto LAB_00111bae;
      }
      else if (uVar4 == 0xf7) {
        if ((((uVar5 == 0) || (it->_M_current == end._M_current)) ||
            (uVar4 = decode_delta(it,end), (int)uVar4 < 0)) ||
           (uVar6 = (ulong)uVar4, (long)end._M_current - (long)it->_M_current < (long)uVar6)) break;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_c8,(ulong)(uVar4 + uVar5));
        if (uVar4 != 0) {
          memmove(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar5,it->_M_current,uVar6);
        }
        it->_M_current = it->_M_current + uVar6;
        bVar9 = bVar7;
        uVar5 = uVar4 + uVar5;
      }
      else if (uVar4 == 0xf0) {
        if (uVar5 != 0) {
          midi_event::midi_event
                    (&local_98,(ulong)local_d4,extended,0,
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(ulong)uVar5);
          midi_track::add_event(&local_58,&local_98);
          if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_a8 = (ulong)local_d4;
        }
        if (((it->_M_current == end._M_current) ||
            (uVar5 = decode_delta(it,end), uVar6 = local_a0, (int)uVar5 < 0)) ||
           (uVar8 = (ulong)uVar5, (long)end._M_current - (long)it->_M_current < (long)uVar8)) break;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_c8,(ulong)(uVar5 + 1));
        *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start = 0xf0;
        if (uVar5 != 0) {
          memmove(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + 1,it->_M_current,uVar8);
        }
        it->_M_current = it->_M_current + uVar8;
        local_d4 = (uint)uVar6;
        bVar9 = bVar7;
        uVar5 = uVar5 + 1;
      }
      else {
        if (bVar9 < 0xf8) break;
        *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start = bVar9;
        midi_event::midi_event
                  (&local_98,local_a0,extended,0,
                   local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,1);
        midi_track::add_event(&local_58,&local_98);
        if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_a8 = local_a0;
        bVar9 = bVar7;
      }
      bVar7 = bVar9;
      if (it->_M_current == end._M_current) break;
    }
    p_timestamp = local_a8 & 0xffffffff;
  }
  *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xff;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0x2f;
  midi_event::midi_event
            (&local_98,p_timestamp,extended,0,
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,2);
  midi_track::add_event(&local_58,&local_98);
  if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00111bae:
  midi_container::add_track(local_38,&local_58);
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_58.m_events);
  return;
}

Assistant:

void midi_processor::process_standard_midi_track( std::vector<uint8_t>::const_iterator & it, std::vector<uint8_t>::const_iterator end, midi_container & p_out, bool is_gmf )
{
    bool needs_end_marker = false;

    midi_track track;
    unsigned current_timestamp = 0;
    unsigned last_event_timestamp = 0;
    unsigned char last_event_code = 0xFF;

    unsigned last_sysex_length = 0;
    unsigned last_sysex_timestamp = 0;

    std::vector<uint8_t> buffer;
    buffer.resize( 3 );

    for (;;)
    {
        if ( !needs_end_marker && it == end ) break;
        int delta = decode_delta( it, end );
        if ( !needs_end_marker && it == end ) break;

        if ( delta < 0 )
        {
            /*"MIDI processor encountered negative delta: " << delta << "; flipping sign.";*/
            delta = -delta;
        }
        
        if ( delta > 1000000 )
            break;

        current_timestamp += delta;
        if ( it == end ) break;
        unsigned char event_code = *it++;
        unsigned data_bytes_read = 0;
        if ( event_code < 0x80 )
        {
            if ( last_event_code == 0xFF ) break; /*throw exception_io_data("First MIDI track event short encoded");*/
            buffer[ data_bytes_read++ ] = event_code;
            event_code = last_event_code;
        }
        if ( event_code < 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            last_event_code = event_code;
            if ( is_gmf && ( event_code & 0xF0 ) == 0xE0 ) continue;
            if ( data_bytes_read < 1 )
            {
                if ( it == end ) break;
                buffer[ 0 ] = *it++;
                ++data_bytes_read;
            }
            bool command_valid = true;
            switch ( event_code & 0xF0 )
            {
            case 0xC0:
            case 0xD0:
                break;
            default:
                if ( it == end )
                {
                    command_valid = false;
                    break;
                }
                buffer[ data_bytes_read ] = *it++;
                ++data_bytes_read;
            }
            if ( !command_valid ) break;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, (midi_event::event_type)(( event_code >> 4 ) - 8), event_code & 0x0F, &buffer[0], data_bytes_read ) );
        }
        else if ( event_code == 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid System Exclusive message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 1 );
            buffer[ 0 ] = 0xF0;
            std::copy( it, it + data_count, buffer.begin() + 1 );
            it += data_count;
            last_sysex_length = data_count + 1;
            last_sysex_timestamp = current_timestamp;
        }
        else if ( event_code == 0xF7 ) // SysEx continuation
        {
            if ( !last_sysex_length ) break;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break;
            if ( end - it < data_count ) break;
            buffer.resize( last_sysex_length + data_count );
            std::copy( it, it + data_count, buffer.begin() + last_sysex_length );
            it += data_count;
            last_sysex_length += data_count;
        }
        else if ( event_code == 0xFF )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            unsigned char meta_type = *it++;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid meta message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 2 );
            buffer[ 0 ] = 0xFF;
            buffer[ 1 ] = meta_type;
            std::copy( it, it + data_count, buffer.begin() + 2 );
            it += data_count;
            if ( meta_type == 0x2F )
                current_timestamp = last_event_timestamp;
            else
                last_event_timestamp = current_timestamp;
            track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], data_count + 2 ) );

            if ( meta_type == 0x2F )
            {
                needs_end_marker = true;
                break;
            }
        }
        else if ( event_code >= 0xF8 && event_code <= 0xFE )
        {
            /* Sequencer specific events, single byte */
            buffer[ 0 ] = event_code;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, midi_event::extended, 0, &buffer[0], 1 ) );
        }
        else break; /*throw exception_io_data("Unhandled MIDI status code");*/
    }

    if ( !needs_end_marker )
    {
        buffer[ 0 ] = 0xFF;
        buffer[ 1 ] = 0x2F;
        track.add_event( midi_event( last_event_timestamp, midi_event::extended, 0, &buffer[0], 2 ) );
    }

    p_out.add_track( track );
}